

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserInputState xVar3;
  xmlParserErrors error;
  unsigned_long uVar4;
  xmlType xVar5;
  xmlChar *pxVar6;
  void *pvVar7;
  xmlChar *check;
  long lVar8;
  void *pvVar9;
  int iVar10;
  xmlParserInputPtr pxVar11;
  ulong uVar12;
  bool bVar13;
  ulong local_38;
  
  uVar12 = 0;
  local_38 = 0;
  pvVar9 = (void *)0x0;
  do {
    lVar8 = 2;
    if (ctxt->instate == XML_PARSER_EOF) {
LAB_00161316:
      (*xmlFree)(pvVar9);
      return;
    }
    xVar5 = ctxt->mlType;
    pxVar11 = ctxt->input;
    if (xVar5 == XML_TYPE_SML) {
      pxVar6 = pxVar11->cur;
      bVar13 = true;
      if ((*pxVar6 != '!') || (iVar10 = 2, pxVar6[1] != '[')) goto LAB_00160fe5;
LAB_00160ef9:
      iVar2 = pxVar11->id;
      pxVar11->cur = pxVar6 + lVar8;
      pxVar11->col = pxVar11->col + iVar10;
      if (pxVar6[lVar8] == '\0') {
        xmlParserInputGrow(pxVar11,0xfa);
      }
      xmlSkipBlankChars(ctxt);
      pxVar11 = ctxt->input;
      pxVar6 = pxVar11->cur;
      if (*pxVar6 != 'I') {
LAB_001612f9:
        error = XML_ERR_CONDSEC_INVALID_KEYWORD;
LAB_00161303:
        xmlFatalErr(ctxt,error,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_00161316;
      }
      if (pxVar6[1] == 'G') {
        if (((pxVar6[2] != 'N') || (pxVar6[3] != 'O')) || ((pxVar6[4] != 'R' || (pxVar6[5] != 'E')))
           ) goto LAB_001612f9;
        pxVar11->cur = pxVar6 + 6;
        pxVar11->col = pxVar11->col + 6;
        if (pxVar6[6] == '\0') {
          xmlParserInputGrow(pxVar11,0xfa);
        }
        xmlSkipBlankChars(ctxt);
        if (*ctxt->input->cur != '[') goto LAB_00161301;
        if (ctxt->input->id != iVar2) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        xmlNextChar(ctxt);
        xVar3 = ctxt->instate;
        iVar10 = ctxt->disableSAX;
        if (ctxt->recovery == 0) {
          ctxt->disableSAX = 1;
        }
        ctxt->instate = XML_PARSER_IGNORE;
        lVar8 = 0;
        while( true ) {
          pxVar11 = ctxt->input;
          pxVar6 = pxVar11->cur;
          xVar1 = *pxVar6;
          if (xVar1 == '\0') break;
          xVar5 = ctxt->mlType;
          if (xVar1 == '<' && xVar5 == XML_TYPE_XML) {
            if ((pxVar6[1] == '!') && (pxVar6[2] == '[')) {
LAB_001611c1:
              pxVar11->cur = pxVar6 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
              pxVar11->col = pxVar11->col + (uint)(xVar5 == XML_TYPE_XML) + 2;
              if (pxVar6[(ulong)(xVar5 == XML_TYPE_XML) + 2] == '\0') {
                xmlParserInputGrow(pxVar11,0xfa);
              }
              lVar8 = lVar8 + 1;
              if (lVar8 == 0) {
                xmlErrMemory(ctxt,(char *)0x0);
                goto LAB_00161316;
              }
            }
            else {
LAB_00161210:
              xmlNextChar(ctxt);
            }
          }
          else {
            if (xVar1 == '!' && xVar5 == XML_TYPE_SML) {
              if (pxVar6[1] == '[') goto LAB_001611c1;
              goto LAB_00161210;
            }
            if (((xVar1 != ']') || (pxVar6[1] != ']')) ||
               ((xVar5 != XML_TYPE_SML && (pxVar6[2] != '>')))) goto LAB_00161210;
            if (lVar8 == 0) break;
            pxVar11->cur = pxVar6 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
            pxVar11->col = pxVar11->col + (uint)(xVar5 == XML_TYPE_XML) + 2;
            if (pxVar6[(ulong)(xVar5 == XML_TYPE_XML) + 2] == '\0') {
              xmlParserInputGrow(pxVar11,0xfa);
            }
            lVar8 = lVar8 + -1;
          }
        }
        ctxt->disableSAX = iVar10;
        ctxt->instate = xVar3;
        if (*pxVar6 != '\0') {
          if (pxVar11->id != iVar2) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
            pxVar11 = ctxt->input;
            pxVar6 = pxVar11->cur;
          }
          pxVar11->cur = pxVar6 + 3;
          pxVar11->col = pxVar11->col + 3;
          if (pxVar6[3] != '\0') goto LAB_00161077;
          goto LAB_001612ab;
        }
        xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
        goto LAB_00161316;
      }
      if ((((pxVar6[1] != 'N') || (pxVar6[2] != 'C')) || (pxVar6[3] != 'L')) ||
         (((pxVar6[4] != 'U' || (pxVar6[5] != 'D')) || (pxVar6[6] != 'E')))) goto LAB_001612f9;
      pxVar11->cur = pxVar6 + 7;
      pxVar11->col = pxVar11->col + 7;
      if (pxVar6[7] == '\0') {
        xmlParserInputGrow(pxVar11,0xfa);
      }
      xmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur != '[') {
LAB_00161301:
        error = XML_ERR_CONDSEC_INVALID;
        goto LAB_00161303;
      }
      if (ctxt->input->id != iVar2) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "All markup of the conditional section is not in the same entity\n");
      }
      xmlNextChar(ctxt);
      pvVar7 = pvVar9;
      if (local_38 <= uVar12) {
        bVar13 = local_38 == 0;
        local_38 = local_38 * 2;
        if (bVar13) {
          local_38 = 4;
        }
        pvVar7 = (*xmlRealloc)(pvVar9,local_38 * 4);
        if (pvVar7 == (void *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_00161316;
        }
      }
      *(int *)((long)pvVar7 + uVar12 * 4) = iVar2;
      uVar12 = uVar12 + 1;
      pvVar9 = pvVar7;
    }
    else {
      if ((xVar5 == XML_TYPE_XML) && ((pxVar6 = pxVar11->cur, *pxVar6 == '<' && (pxVar6[1] == '!')))
         ) {
        iVar10 = 3;
        lVar8 = 3;
        if (pxVar6[2] == '[') goto LAB_00160ef9;
      }
      bVar13 = false;
LAB_00160fe5:
      pxVar6 = pxVar11->cur;
      if ((((uVar12 == 0) || (*pxVar6 != ']')) || (pxVar6[1] != ']')) ||
         ((!bVar13 && (pxVar6[2] != '>')))) {
        uVar4 = pxVar11->consumed;
        xmlParseMarkupDecl(ctxt);
        if ((ctxt->input->cur == pxVar6) && ((ulong)(uint)uVar4 == ctxt->input->consumed)) {
          error = XML_ERR_EXT_SUBSET_NOT_FINISHED;
          goto LAB_00161303;
        }
      }
      else {
        if (pxVar11->id != *(int *)((long)pvVar9 + uVar12 * 4 + -4)) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
          xVar5 = ctxt->mlType;
          pxVar11 = ctxt->input;
          pxVar6 = pxVar11->cur;
        }
        uVar12 = uVar12 - 1;
        pxVar11->cur = pxVar6 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
        pxVar11->col = (uint)(xVar5 == XML_TYPE_XML) + pxVar11->col + 2;
        if (pxVar6[(ulong)(xVar5 == XML_TYPE_XML) + 2] == '\0') {
LAB_001612ab:
          xmlParserInputGrow(pxVar11,0xfa);
        }
      }
    }
LAB_00161077:
    if (uVar12 == 0) goto LAB_00161316;
    xmlSkipBlankChars(ctxt);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  } while( true );
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    DEBUG_ENTER(("xmlParseConditionalSections(%s);\n", dbgCtxt(ctxt)));

    while (ctxt->instate != XML_PARSER_EOF) {
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
            int id = ctxt->input->id;

            SKIP_MLI(3);	/* '<', '!', '[' */
            SKIP_BLANKS;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;

                    inputIdsSize = (inputIdsSize == 0 ? 4 : inputIdsSize * 2);
                    tmp = (int *) xmlRealloc(inputIds,
                            inputIdsSize * sizeof(int));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt, NULL);
                        goto error;
                    }
                    inputIds = tmp;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                int state;
                xmlParserInputState instate;
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                /*
                 * Parse up to the end of the conditional section but disable
                 * SAX event generating DTD building in the meantime
                 */
                state = ctxt->disableSAX;
                instate = ctxt->instate;
                if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                ctxt->instate = XML_PARSER_IGNORE;

                while (RAW != 0) {
                    if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
                        SKIP_MLI(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt, NULL);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (ISSML || (NXT(2) == '>'))) {
                        if (ignoreDepth == 0)
                            break;
                        SKIP_MLI(3);
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                ctxt->disableSAX = state;
                ctxt->instate = instate;

		if (RAW == 0) {
		    xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                    goto error;
		}
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                SKIP(3);
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (ISSML || (NXT(2) == '>'))) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP_MLI(3);
        } else {
            const xmlChar *check = CUR_PTR;
            unsigned int cons = ctxt->input->consumed;

            xmlParseMarkupDecl(ctxt);

            if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
                xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        }

        if (depth == 0)
            break;

        SKIP_BLANKS;
        GROW;
    }

error:
    xmlFree(inputIds);
    RETURN();
}